

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Enterprise.cpp
# Opt level: O2

void __thiscall
Enterprise::ConcreteMachine<true,_false>::advance_nick
          (ConcreteMachine<true,_false> *this,HalfCycles duration)

{
  bool bVar1;
  
  bVar1 = JustInTimeActor<Enterprise::Nick,_HalfCycles,_40434603,_11360000>::operator+=
                    (&this->nick_,duration);
  if (bVar1) {
    bVar1 = (this->nick_).object_.interrupt_line_;
    if ((bVar1 == true) && (this->previous_nick_interrupt_line_ == false)) {
      set_interrupts(this,' ',(HalfCycles)
                              (this->nick_).time_overrun_.super_WrappedInt<HalfCycles>.length_);
    }
    this->previous_nick_interrupt_line_ = bVar1;
  }
  return;
}

Assistant:

forceinline void advance_nick(HalfCycles duration) {
			if(nick_ += duration) {
				const auto nick = nick_.last_valid();
				const bool nick_interrupt_line = nick->get_interrupt_line();
				if(nick_interrupt_line && !previous_nick_interrupt_line_) {
					set_interrupts(uint8_t(Dave::Interrupt::Nick), nick_.last_sequence_point_overrun());
				}
				previous_nick_interrupt_line_ = nick_interrupt_line;
			}
		}